

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_8x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar7;
  ushort uVar8;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar9 [16];
  ushort uVar22;
  ushort uVar23;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  __m128i weighted_px_1;
  int local_60c;
  int local_5dc;
  undefined8 *local_548;
  byte local_4c8;
  undefined1 uStack_4c7;
  undefined1 uStack_4c6;
  undefined1 uStack_4c5;
  byte bStack_4c4;
  undefined1 uStack_4c3;
  undefined1 uStack_4c2;
  undefined1 uStack_4c1;
  byte local_488;
  undefined1 uStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  byte bStack_484;
  undefined1 uStack_483;
  undefined1 uStack_482;
  undefined1 uStack_481;
  ushort uStack_416;
  ushort uStack_414;
  ushort uStack_412;
  ushort uStack_40e;
  ushort uStack_40c;
  ushort uStack_40a;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  __m128i left_y_1;
  __m128i y_select_1;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  int y_mask_1;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  
  bVar2 = *(byte *)(in_RDX + 7);
  uVar6 = (ushort)bVar2;
  uStack_416 = (ushort)bVar2;
  uStack_414 = (ushort)bVar2;
  uStack_412 = (ushort)bVar2;
  uStack_40e = (ushort)bVar2;
  uStack_40c = (ushort)bVar2;
  uStack_40a = (ushort)bVar2;
  uVar1 = *in_RCX;
  local_488 = (byte)uVar1;
  uStack_487 = (undefined1)((ulong)uVar1 >> 8);
  uStack_486 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_485 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_484 = (byte)((ulong)uVar1 >> 0x20);
  uStack_483 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_482 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_481 = (undefined1)((ulong)uVar1 >> 0x38);
  local_548 = in_RDI;
  for (local_5dc = 0x1000100; local_5dc < 0xf0e0f0f; local_5dc = local_5dc + 0x2020202) {
    auVar4._4_4_ = local_5dc;
    auVar4._0_4_ = local_5dc;
    auVar4._12_4_ = local_5dc;
    auVar4._8_4_ = local_5dc;
    auVar5[1] = 0;
    auVar5[0] = local_488;
    auVar5[2] = uStack_487;
    auVar5[3] = 0;
    auVar5[4] = uStack_486;
    auVar5[5] = 0;
    auVar5[6] = uStack_485;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_484;
    auVar5[10] = uStack_483;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_482;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_481;
    auVar5[0xf] = 0;
    auVar9 = pshufb(auVar5,auVar4);
    local_d8 = auVar9._0_2_;
    sStack_d6 = auVar9._2_2_;
    sStack_d4 = auVar9._4_2_;
    sStack_d2 = auVar9._6_2_;
    sStack_d0 = auVar9._8_2_;
    sStack_ce = auVar9._10_2_;
    sStack_cc = auVar9._12_2_;
    sStack_ca = auVar9._14_2_;
    uVar7 = uVar6 + local_d8 * 0xff + 0x80;
    uVar10 = uStack_416 * 0x3b + sStack_d6 * 0xc5 + 0x80;
    uVar12 = uStack_414 * 0x6e + sStack_d4 * 0x92 + 0x80;
    uVar14 = uStack_412 * 0x97 + sStack_d2 * 0x69 + 0x80;
    uVar16 = uVar6 * 0xb7 + sStack_d0 * 0x49 + 0x80;
    uVar18 = uStack_40e * 0xce + sStack_ce * 0x32 + 0x80;
    uVar20 = uStack_40c * 0xdb + sStack_cc * 0x25 + 0x80;
    uVar22 = uStack_40a * 0xe0 + sStack_ca * 0x20 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar11 = uVar10 >> 8;
    uVar13 = uVar12 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    *local_548 = CONCAT17((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23),
                          CONCAT16((uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) -
                                   (0xff < uVar21),
                                   CONCAT15((uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) -
                                            (0xff < uVar19),
                                            CONCAT14((uVar17 != 0) * (uVar17 < 0x100) *
                                                     (char)(uVar16 >> 8) - (0xff < uVar17),
                                                     CONCAT13((uVar15 != 0) * (uVar15 < 0x100) *
                                                              (char)(uVar14 >> 8) - (0xff < uVar15),
                                                              CONCAT12((uVar13 != 0) *
                                                                       (uVar13 < 0x100) *
                                                                       (char)(uVar12 >> 8) -
                                                                       (0xff < uVar13),
                                                                       CONCAT11((uVar11 != 0) *
                                                                                (uVar11 < 0x100) *
                                                                                (char)(uVar10 >> 8)
                                                                                - (0xff < uVar11),
                                                                                (uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8)))))))
                         );
    local_548 = (undefined8 *)(in_RSI + (long)local_548);
  }
  uVar1 = in_RCX[1];
  local_4c8 = (byte)uVar1;
  uStack_4c7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_4c6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_4c5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_4c4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_4c3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_4c2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_4c1 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_60c = 0x1000100; local_60c < 0xf0e0f0f; local_60c = local_60c + 0x2020202) {
    auVar9._4_4_ = local_60c;
    auVar9._0_4_ = local_60c;
    auVar9._12_4_ = local_60c;
    auVar9._8_4_ = local_60c;
    auVar3[1] = 0;
    auVar3[0] = local_4c8;
    auVar3[2] = uStack_4c7;
    auVar3[3] = 0;
    auVar3[4] = uStack_4c6;
    auVar3[5] = 0;
    auVar3[6] = uStack_4c5;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_4c4;
    auVar3[10] = uStack_4c3;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_4c2;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_4c1;
    auVar3[0xf] = 0;
    auVar9 = pshufb(auVar3,auVar9);
    y_select_1[1]._0_2_ = auVar9._0_2_;
    y_select_1[1]._2_2_ = auVar9._2_2_;
    y_select_1[1]._4_2_ = auVar9._4_2_;
    y_select_1[1]._6_2_ = auVar9._6_2_;
    sStack_50 = auVar9._8_2_;
    sStack_4e = auVar9._10_2_;
    sStack_4c = auVar9._12_2_;
    sStack_4a = auVar9._14_2_;
    uVar7 = uVar6 + (short)y_select_1[1] * 0xff + 0x80;
    uVar10 = uStack_416 * 0x3b + y_select_1[1]._2_2_ * 0xc5 + 0x80;
    uVar12 = uStack_414 * 0x6e + y_select_1[1]._4_2_ * 0x92 + 0x80;
    uVar14 = uStack_412 * 0x97 + y_select_1[1]._6_2_ * 0x69 + 0x80;
    uVar16 = uVar6 * 0xb7 + sStack_50 * 0x49 + 0x80;
    uVar18 = uStack_40e * 0xce + sStack_4e * 0x32 + 0x80;
    uVar20 = uStack_40c * 0xdb + sStack_4c * 0x25 + 0x80;
    uVar22 = uStack_40a * 0xe0 + sStack_4a * 0x20 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar11 = uVar10 >> 8;
    uVar13 = uVar12 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    *local_548 = CONCAT17((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23),
                          CONCAT16((uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) -
                                   (0xff < uVar21),
                                   CONCAT15((uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) -
                                            (0xff < uVar19),
                                            CONCAT14((uVar17 != 0) * (uVar17 < 0x100) *
                                                     (char)(uVar16 >> 8) - (0xff < uVar17),
                                                     CONCAT13((uVar15 != 0) * (uVar15 < 0x100) *
                                                              (char)(uVar14 >> 8) - (0xff < uVar15),
                                                              CONCAT12((uVar13 != 0) *
                                                                       (uVar13 < 0x100) *
                                                                       (char)(uVar12 >> 8) -
                                                                       (0xff < uVar13),
                                                                       CONCAT11((uVar11 != 0) *
                                                                                (uVar11 < 0x100) *
                                                                                (char)(uVar10 >> 8)
                                                                                - (0xff < uVar11),
                                                                                (uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8)))))))
                         );
    local_548 = (undefined8 *)(in_RSI + (long)local_548);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_8x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
}